

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_decode_tile(opj_j2k_t *p_j2k,OPJ_UINT32 p_tile_index,OPJ_BYTE *p_data,
                            OPJ_UINT32 p_data_size,opj_stream_private_t *p_stream,
                            opj_event_mgr_t *p_manager)

{
  OPJ_BOOL OVar1;
  opj_tcp_t *p_tcp;
  OPJ_OFF_T OVar2;
  OPJ_SIZE_T OVar3;
  opj_image_t *local_78;
  opj_image_t *l_image_for_bounds;
  opj_tcp_t *l_tcp;
  OPJ_BYTE l_data [2];
  opj_event_mgr_t *poStack_58;
  OPJ_UINT32 l_current_marker;
  opj_event_mgr_t *p_manager_local;
  opj_stream_private_t *p_stream_local;
  OPJ_UINT32 p_data_size_local;
  OPJ_BYTE *p_data_local;
  OPJ_UINT32 p_tile_index_local;
  opj_j2k_t *p_j2k_local;
  
  poStack_58 = p_manager;
  if (p_stream == (opj_stream_private_t *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x22de,
                  "OPJ_BOOL opj_j2k_decode_tile(opj_j2k_t *, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k != (opj_j2k_t *)0x0) {
    if (p_manager == (opj_event_mgr_t *)0x0) {
      __assert_fail("p_manager != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                    ,0x22e0,
                    "OPJ_BOOL opj_j2k_decode_tile(opj_j2k_t *, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32, opj_stream_private_t *, opj_event_mgr_t *)"
                   );
    }
    if ((((p_j2k->m_specific_param).m_decoder.m_state & 0x80) == 0) ||
       (p_tile_index != p_j2k->m_current_tile_number)) {
      p_j2k_local._4_4_ = 0;
    }
    else {
      p_tcp = (p_j2k->m_cp).tcps + p_tile_index;
      if (p_tcp->m_data == (OPJ_BYTE *)0x0) {
        opj_j2k_tcp_destroy(p_tcp);
        p_j2k_local._4_4_ = 0;
      }
      else {
        if (p_j2k->m_output_image == (opj_image_t *)0x0) {
          local_78 = p_j2k->m_private_image;
        }
        else {
          local_78 = p_j2k->m_output_image;
        }
        OVar1 = opj_tcd_decode_tile(p_j2k->m_tcd,local_78->x0,local_78->y0,local_78->x1,local_78->y1
                                    ,(p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode,
                                    (p_j2k->m_specific_param).m_decoder.m_comps_indices_to_decode,
                                    p_tcp->m_data,p_tcp->m_data_size,p_tile_index,p_j2k->cstr_index,
                                    p_manager);
        if (OVar1 == 0) {
          opj_j2k_tcp_destroy(p_tcp);
          (p_j2k->m_specific_param).m_decoder.m_state =
               (p_j2k->m_specific_param).m_decoder.m_state | 0x8000;
          opj_event_msg(poStack_58,1,"Failed to decode.\n");
          p_j2k_local._4_4_ = 0;
        }
        else {
          if (p_data != (OPJ_BYTE *)0x0) {
            OVar1 = opj_tcd_update_tile_data(p_j2k->m_tcd,p_data,p_data_size);
            if (OVar1 == 0) {
              return 0;
            }
            opj_j2k_tcp_data_destroy(p_tcp);
          }
          *(byte *)((long)&p_j2k->m_specific_param + 0x50) =
               *(byte *)((long)&p_j2k->m_specific_param + 0x50) & 0xfe;
          (p_j2k->m_specific_param).m_decoder.m_state =
               (p_j2k->m_specific_param).m_decoder.m_state & 0xffffff7f;
          OVar2 = opj_stream_get_number_byte_left(p_stream);
          if ((OVar2 == 0) && ((p_j2k->m_specific_param).m_decoder.m_state == 0x40)) {
            p_j2k_local._4_4_ = 1;
          }
          else {
            if ((p_j2k->m_specific_param).m_decoder.m_state != 0x100) {
              OVar3 = opj_stream_read_data(p_stream,(OPJ_BYTE *)((long)&l_tcp + 2),2,poStack_58);
              if (OVar3 != 2) {
                opj_event_msg(poStack_58,1,"Stream too short\n");
                return 0;
              }
              opj_read_bytes_LE((OPJ_BYTE *)((long)&l_tcp + 2),(OPJ_UINT32 *)((long)&l_tcp + 4),2);
              if (l_tcp._4_4_ == 0xffd9) {
                p_j2k->m_current_tile_number = 0;
                (p_j2k->m_specific_param).m_decoder.m_state = 0x100;
              }
              else if (l_tcp._4_4_ != 0xff90) {
                OVar2 = opj_stream_get_number_byte_left(p_stream);
                if (OVar2 == 0) {
                  (p_j2k->m_specific_param).m_decoder.m_state = 0x40;
                  opj_event_msg(poStack_58,2,"Stream does not end with EOC\n");
                  return 1;
                }
                opj_event_msg(poStack_58,1,"Stream too short, expected SOT\n");
                return 0;
              }
            }
            p_j2k_local._4_4_ = 1;
          }
        }
      }
    }
    return p_j2k_local._4_4_;
  }
  __assert_fail("p_j2k != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0x22df,
                "OPJ_BOOL opj_j2k_decode_tile(opj_j2k_t *, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32, opj_stream_private_t *, opj_event_mgr_t *)"
               );
}

Assistant:

OPJ_BOOL opj_j2k_decode_tile(opj_j2k_t * p_j2k,
                             OPJ_UINT32 p_tile_index,
                             OPJ_BYTE * p_data,
                             OPJ_UINT32 p_data_size,
                             opj_stream_private_t *p_stream,
                             opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 l_current_marker;
    OPJ_BYTE l_data [2];
    opj_tcp_t * l_tcp;
    opj_image_t* l_image_for_bounds;

    /* preconditions */
    assert(p_stream != 00);
    assert(p_j2k != 00);
    assert(p_manager != 00);

    if (!(p_j2k->m_specific_param.m_decoder.m_state & J2K_STATE_DATA)
            || (p_tile_index != p_j2k->m_current_tile_number)) {
        return OPJ_FALSE;
    }

    l_tcp = &(p_j2k->m_cp.tcps[p_tile_index]);
    if (! l_tcp->m_data) {
        opj_j2k_tcp_destroy(l_tcp);
        return OPJ_FALSE;
    }

    /* When using the opj_read_tile_header / opj_decode_tile_data API */
    /* such as in test_tile_decoder, m_output_image is NULL, so fall back */
    /* to the full image dimension. This is a bit surprising that */
    /* opj_set_decode_area() is only used to determinte intersecting tiles, */
    /* but full tile decoding is done */
    l_image_for_bounds = p_j2k->m_output_image ? p_j2k->m_output_image :
                         p_j2k->m_private_image;
    if (! opj_tcd_decode_tile(p_j2k->m_tcd,
                              l_image_for_bounds->x0,
                              l_image_for_bounds->y0,
                              l_image_for_bounds->x1,
                              l_image_for_bounds->y1,
                              p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode,
                              p_j2k->m_specific_param.m_decoder.m_comps_indices_to_decode,
                              l_tcp->m_data,
                              l_tcp->m_data_size,
                              p_tile_index,
                              p_j2k->cstr_index, p_manager)) {
        opj_j2k_tcp_destroy(l_tcp);
        p_j2k->m_specific_param.m_decoder.m_state |= J2K_STATE_ERR;
        opj_event_msg(p_manager, EVT_ERROR, "Failed to decode.\n");
        return OPJ_FALSE;
    }

    /* p_data can be set to NULL when the call will take care of using */
    /* itself the TCD data. This is typically the case for whole single */
    /* tile decoding optimization. */
    if (p_data != NULL) {
        if (! opj_tcd_update_tile_data(p_j2k->m_tcd, p_data, p_data_size)) {
            return OPJ_FALSE;
        }

        /* To avoid to destroy the tcp which can be useful when we try to decode a tile decoded before (cf j2k_random_tile_access)
        * we destroy just the data which will be re-read in read_tile_header*/
        /*opj_j2k_tcp_destroy(l_tcp);
        p_j2k->m_tcd->tcp = 0;*/
        opj_j2k_tcp_data_destroy(l_tcp);
    }

    p_j2k->m_specific_param.m_decoder.m_can_decode = 0;
    p_j2k->m_specific_param.m_decoder.m_state &= (~(OPJ_UINT32)J2K_STATE_DATA);

    if (opj_stream_get_number_byte_left(p_stream) == 0
            && p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_NEOC) {
        return OPJ_TRUE;
    }

    if (p_j2k->m_specific_param.m_decoder.m_state != J2K_STATE_EOC) {
        if (opj_stream_read_data(p_stream, l_data, 2, p_manager) != 2) {
            opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
            return OPJ_FALSE;
        }

        opj_read_bytes(l_data, &l_current_marker, 2);

        if (l_current_marker == J2K_MS_EOC) {
            p_j2k->m_current_tile_number = 0;
            p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_EOC;
        } else if (l_current_marker != J2K_MS_SOT) {
            if (opj_stream_get_number_byte_left(p_stream) == 0) {
                p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_NEOC;
                opj_event_msg(p_manager, EVT_WARNING, "Stream does not end with EOC\n");
                return OPJ_TRUE;
            }
            opj_event_msg(p_manager, EVT_ERROR, "Stream too short, expected SOT\n");
            return OPJ_FALSE;
        }
    }

    return OPJ_TRUE;
}